

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

void __thiscall Node::ScanVarList(Node *this,VARTYPE ThisType,VARCLASS ThisClass,int Status)

{
  pointer *pppNVar1;
  int iVar2;
  VARTYPE newType;
  ostream *this_00;
  VariableStruct *pVVar3;
  string local_370 [32];
  undefined1 local_350 [8];
  VariableStruct NewVar_3;
  VARTYPE local_294;
  string local_290 [4];
  VARTYPE FinalType_1;
  undefined1 local_270 [8];
  VariableStruct NewVar_2;
  VARTYPE local_1b4;
  string local_1b0 [4];
  VARTYPE FinalType;
  undefined1 local_190 [8];
  VariableStruct NewVar_1;
  string local_e8 [32];
  undefined1 local_c8 [8];
  VariableStruct NewVar;
  VARCLASS ThisClass_1;
  VariableStruct *ThisVar;
  int Status_local;
  VARCLASS ThisClass_local;
  VARTYPE ThisType_local;
  Node *this_local;
  
  iVar2 = this->Type;
  if (iVar2 != 0x3d) {
    if (iVar2 == 0x10f) {
      if (this->Tree[0] == (Node *)0x0) {
        return;
      }
      ScanVarList(this->Tree[0],ThisType,ThisClass,0);
      return;
    }
    if (iVar2 == 0x1cd) {
      pVVar3 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
      if (pVVar3 == (VariableStruct *)0x0) {
        local_1b4 = ThisType;
        if (ThisType == VARTYPE_NONE) {
          pppNVar1 = &NewVar_2.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)pppNVar1,(string *)&this->TextValue);
          local_1b4 = GuessVarType((string *)pppNVar1);
          std::__cxx11::string::~string
                    ((string *)
                     &NewVar_2.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::string::string(local_290,(string *)&this->TextValue);
        VariableStruct::VariableStruct
                  ((VariableStruct *)local_270,(string *)local_290,local_1b4,ThisClass,Status,0);
        std::__cxx11::string::~string(local_290);
        VariableList::Append(Variables,(VariableStruct *)local_270,0);
        VariableStruct::~VariableStruct((VariableStruct *)local_270);
      }
      if (this->Tree[0] == (Node *)0x0) {
        return;
      }
      VariableScanOne(this->Tree[0],0);
      return;
    }
    if (iVar2 - 0x1ceU < 3) {
      return;
    }
    if (iVar2 == 0x1d3) {
      pVVar3 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
      if (pVVar3 != (VariableStruct *)0x0) {
        return;
      }
      local_294 = ThisType;
      if (ThisType == VARTYPE_NONE) {
        pppNVar1 = &NewVar_3.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::string((string *)pppNVar1,(string *)&this->TextValue);
        local_294 = GuessVarType((string *)pppNVar1);
        std::__cxx11::string::~string
                  ((string *)
                   &NewVar_3.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::string(local_370,(string *)&this->TextValue);
      VariableStruct::VariableStruct
                ((VariableStruct *)local_350,(string *)local_370,local_294,ThisClass,Status,0);
      std::__cxx11::string::~string(local_370);
      VariableList::Append(Variables,(VariableStruct *)local_350,0);
      VariableStruct::~VariableStruct((VariableStruct *)local_350);
      return;
    }
    if (iVar2 == 0x1d8) {
      newType = ScanType(this->Tree[1]);
      if (this->Tree[0] != (Node *)0x0) {
        pVVar3 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
        if (pVVar3 == (VariableStruct *)0x0) {
          NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_ = this->Tree[2] != (Node *)0x0;
          std::__cxx11::string::string(local_e8,(string *)&this->Tree[0]->TextValue);
          VariableStruct::VariableStruct
                    ((VariableStruct *)local_c8,(string *)local_e8,newType,
                     NewVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,Status,0);
          std::__cxx11::string::~string(local_e8);
          VariableList::Append(Variables,(VariableStruct *)local_c8,0);
          VariableStruct::~VariableStruct((VariableStruct *)local_c8);
        }
        else {
          pVVar3->Class = VARCLASS_NONE;
          pVVar3->Type = newType;
        }
      }
      if (this->Tree[2] != (Node *)0x0) {
        ScanVarList(this->Tree[2],newType,ThisClass,Status);
      }
      if (this->Block[0] == (Node *)0x0) {
        return;
      }
      ScanVarList(this->Block[0],newType,ThisClass,Status);
      return;
    }
    if (iVar2 == 0x1d9) {
      if (this->Tree[1] == (Node *)0x0) {
        this_00 = std::operator<<((ostream *)&std::cerr,"Scanning: Type = NULL in BAS_V_DEFINEFUN");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        Status_local = 0;
      }
      else {
        Status_local = ScanType(this->Tree[1]);
      }
      if (this->Tree[0] != (Node *)0x0) {
        pVVar3 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
        if (pVVar3 == (VariableStruct *)0x0) {
          std::__cxx11::string::string(local_1b0,(string *)&this->Tree[0]->TextValue);
          VariableStruct::VariableStruct
                    ((VariableStruct *)local_190,(string *)local_1b0,Status_local,VARCLASS_FUNC,
                     Status,0);
          std::__cxx11::string::~string(local_1b0);
          VariableList::Append(Variables,(VariableStruct *)local_190,1);
          VariableStruct::~VariableStruct((VariableStruct *)local_190);
        }
        else {
          pVVar3->Class = VARCLASS_FUNC;
          pVVar3->Type = Status_local;
        }
      }
      if (this->Tree[2] != (Node *)0x0) {
        ScanVarList(this->Tree[2],Status_local,VARCLASS_NONE,1);
      }
      if (this->Block[0] == (Node *)0x0) {
        return;
      }
      ScanVarList(this->Block[0],Status_local,ThisClass,Status);
      return;
    }
    if (iVar2 != 0x1f2) {
      if (iVar2 != 500 && iVar2 != 0x1f5) {
        return;
      }
      if (this->Tree[0] != (Node *)0x0) {
        ScanVarList(this->Tree[0],ThisType,ThisClass,Status);
      }
      if (this->Tree[1] == (Node *)0x0) {
        return;
      }
      ScanVarList(this->Tree[1],ThisType,ThisClass,Status);
      return;
    }
  }
  ScanVarList(this->Tree[0],ThisType,ThisClass,Status);
  return;
}

Assistant:

void Node::ScanVarList(
	VARTYPE ThisType,	/**< This type */
	VARCLASS ThisClass,	/**< This class */
	int Status		/**< This status */
)
{
	VariableStruct* ThisVar;

	switch(Type)
	{
	case BAS_N_LIST:
	case BAS_N_ASSIGNLIST:

		if (Tree[0] != 0)
		{
			Tree[0]->ScanVarList(ThisType, ThisClass, Status);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->ScanVarList(ThisType, ThisClass, Status);
		}
		break;

	case '=':
	case BAS_N_ASSIGN:

		Tree[0]->ScanVarList(ThisType, ThisClass, Status);
		break;

	case BAS_V_DEFINEVAR:

		ThisType = Tree[1]->ScanType();

		if (Tree[0] != 0)
		{
			ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);
			if (ThisVar == 0)
			{
				VARCLASS ThisClass = VARCLASS_NONE;
				if (Tree[2] != 0)
				{
					ThisClass = VARCLASS_ARRAY;
				}

				//
				// Create variable
				//
				VariableStruct NewVar(Tree[0]->TextValue,
					ThisType, ThisClass, Status);

				//
				// Add to variable table
				//
				Variables->Append(NewVar, false);
			}
			else
			{
				ThisVar->Class =VARCLASS_NONE;
				ThisVar->Type = ThisType;
			}
		}

		if (Tree[2] != NULL)
		{
			Tree[2]->ScanVarList(ThisType, ThisClass, Status);
		}

		if (Block[0] != NULL)
		{
			Block[0]->ScanVarList(ThisType, ThisClass, Status);
		}

		break;

	case BAS_V_DEFINEFUN:

		if (Tree[1] != 0)
		{
			ThisType = Tree[1]->ScanType();
		}
		else
		{
			std::cerr << "Scanning: Type = NULL in BAS_V_DEFINEFUN" << std::endl;
			ThisType = VARTYPE_NONE;
		}
		if (Tree[0] != 0)
		{
			ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);
			if (ThisVar == 0)
			{
				//
				// Create variable
				//
				VariableStruct NewVar(Tree[0]->TextValue,
					ThisType, VARCLASS_FUNC, Status);

				//
				// Add to variable table
				//
				Variables->Append(NewVar, true);
			}
			else
			{
				ThisVar->Class = VARCLASS_FUNC;
				ThisVar->Type = ThisType;
			}
		}

		if (Tree[2] != NULL)
		{
			Tree[2]->ScanVarList(ThisType, VARCLASS_NONE, true);
		}

		if (Block[0] != NULL)
		{
			Block[0]->ScanVarList(ThisType, ThisClass, Status);
		}

		break;

	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
	case BAS_V_INT:
		// Ignore various numeric constants
		break;

	case BAS_V_FUNCTION:
		ThisVar = Variables->Lookup(TextValue, Tree[0]);
		if (ThisVar == 0)
		{
			VARTYPE FinalType = ThisType;
			if (FinalType == VARTYPE_NONE)
			{
				FinalType = GuessVarType(TextValue);
			}
			VariableStruct NewVar(TextValue,
				FinalType, ThisClass, Status);
			Variables->Append(NewVar);
		}
		if (Tree[0] != NULL)
		{
			Tree[0]->VariableScanOne(false);
		}
		break;

	case BAS_S_BY:
		if (Tree[0] != NULL)
		{
			Tree[0]->ScanVarList(ThisType, ThisClass, false);
		}
		break;

	case BAS_V_NAME:
		ThisVar = Variables->Lookup(TextValue, Tree[0]);
		if (ThisVar == 0)
		{
			VARTYPE FinalType = ThisType;
			if (FinalType == VARTYPE_NONE)
			{
				FinalType = GuessVarType(TextValue);
			}
			VariableStruct NewVar(TextValue,
				FinalType, ThisClass, Status);
			Variables->Append(NewVar);
		}
		break;
	}
}